

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

iterator __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
          (intrusive_list<(anonymous_namespace)::TestObject> *this,iterator pos,
          unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
          *node)

{
  TestObject *pTVar1;
  bool bVar2;
  pointer pTVar3;
  reference pTVar4;
  TestObject *pTVar5;
  TestObject *extraout_RDX_00;
  iterator iVar6;
  iterator iVar7;
  iterator rhs;
  iterator local_30;
  _Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false> local_20;
  TestObject *extraout_RDX;
  
  local_30.node_ = pos.node_;
  local_30.list_ = pos.list_;
  pTVar1 = (node->_M_t).
           super___uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl;
  if (((pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ ==
       (TestObject *)0x0) &&
     ((pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
      (TestObject *)0x0)) {
    rhs.node_ = (TestObject *)0x0;
    rhs.list_ = this;
    bVar2 = iterator::operator==(&local_30,rhs);
    if (bVar2) {
      local_20._M_head_impl =
           (node->_M_t).
           super___uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl;
      (node->_M_t).
      super___uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
      .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl =
           (TestObject *)0x0;
      push_back(this,(unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                      *)&local_20);
      std::
      unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                     *)&local_20);
      iVar6.list_ = back(this);
      iVar6.node_ = extraout_RDX;
      return iVar6;
    }
    pTVar1 = (node->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
             .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl;
    (node->_M_t).
    super___uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
    .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl =
         (TestObject *)0x0;
    pTVar3 = iterator::operator->(&local_30);
    (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
         (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
    pTVar4 = iterator::operator*(&local_30);
    (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar4;
    pTVar3 = iterator::operator->(&local_30);
    pTVar5 = (TestObject *)this;
    if ((pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ !=
        (TestObject *)0x0) {
      pTVar3 = iterator::operator->(&local_30);
      pTVar5 = (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
    }
    (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar1;
    iVar7.list_ = iterator::operator->(&local_30);
    ((iVar7.list_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar1;
    this->size_ = this->size_ + 1;
    iVar7.node_ = extraout_RDX_00;
    return iVar7;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0x205,
                "typename intrusive_list<T>::iterator wabt::intrusive_list<(anonymous namespace)::TestObject>::insert(iterator, std::unique_ptr<T>) [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

inline typename intrusive_list<T>::iterator intrusive_list<T>::insert(
    iterator pos,
    std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p;
  if (pos == end()) {
    push_back(std::move(node));
    node_p = &back();
  } else {
    node_p = node.release();
    node_p->prev_ = pos->prev_;
    node_p->next_ = &*pos;
    if (pos->prev_) {
      pos->prev_->next_ = node_p;
    } else {
      first_ = node_p;
    }
    pos->prev_ = node_p;
    size_++;
  }
  return iterator(*this, node_p);
}